

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

ClientMetric * __thiscall
prometheus::Histogram::Collect(ClientMetric *__return_storage_ptr__,Histogram *this)

{
  size_type __n;
  double dVar1;
  const_reference this_00;
  const_reference pvVar2;
  double dVar3;
  undefined1 auVar4 [16];
  value_type local_b0;
  undefined1 local_58 [8];
  Bucket bucket;
  size_t i;
  ulong local_30;
  unsigned_long_long cumulative_count;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Histogram *this_local;
  ClientMetric *metric;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  (__return_storage_ptr__->untyped).value = 0.0;
  __return_storage_ptr__->timestamp_ms = 0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_sum = 0.0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_count = 0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->summary).sample_count = 0;
  (__return_storage_ptr__->summary).sample_sum = 0.0;
  (__return_storage_ptr__->gauge).value = 0.0;
  (__return_storage_ptr__->info).value = 0.0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->counter).value = 0.0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ClientMetric::ClientMetric(__return_storage_ptr__);
  local_30 = 0;
  __n = std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::size
                  (&this->bucket_counts_);
  std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>::
  reserve(&(__return_storage_ptr__->histogram).bucket,__n);
  for (bucket.upper_bound = 0.0; dVar3 = bucket.upper_bound,
      dVar1 = (double)std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::size
                                (&this->bucket_counts_), (ulong)dVar3 < (ulong)dVar1;
      bucket.upper_bound = (double)((long)bucket.upper_bound + 1)) {
    this_00 = std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::operator[]
                        (&this->bucket_counts_,(size_type)bucket.upper_bound);
    dVar3 = Counter::Value(this_00);
    auVar4._8_4_ = (int)(local_30 >> 0x20);
    auVar4._0_8_ = local_30;
    auVar4._12_4_ = 0x45300000;
    dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0) + dVar3;
    local_30 = (ulong)dVar3;
    local_30 = local_30 | (long)(dVar3 - 9.223372036854776e+18) & (long)local_30 >> 0x3f;
    memset(local_58,0,0x10);
    ClientMetric::Bucket::Bucket((Bucket *)local_58);
    dVar3 = bucket.upper_bound;
    local_58 = (undefined1  [8])local_30;
    dVar1 = (double)std::vector<double,_std::allocator<double>_>::size(&this->bucket_boundaries_);
    if (dVar3 == dVar1) {
      local_b0 = std::numeric_limits<double>::infinity();
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->bucket_boundaries_,(size_type)bucket.upper_bound);
      local_b0 = *pvVar2;
    }
    bucket.cumulative_count = (uint64_t)local_b0;
    std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
    ::push_back(&(__return_storage_ptr__->histogram).bucket,(value_type *)local_58);
  }
  (__return_storage_ptr__->histogram).sample_count = local_30;
  dVar3 = Gauge::Value(&this->sum_);
  (__return_storage_ptr__->histogram).sample_sum = dVar3;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

ClientMetric Histogram::Collect() const {
  std::lock_guard<std::mutex> lock(mutex_);

  auto metric = ClientMetric{};

  auto cumulative_count = 0ULL;
  metric.histogram.bucket.reserve(bucket_counts_.size());
  for (std::size_t i{0}; i < bucket_counts_.size(); ++i) {
    cumulative_count += bucket_counts_[i].Value();
    auto bucket = ClientMetric::Bucket{};
    bucket.cumulative_count = cumulative_count;
    bucket.upper_bound = (i == bucket_boundaries_.size()
                              ? std::numeric_limits<double>::infinity()
                              : bucket_boundaries_[i]);
    metric.histogram.bucket.push_back(std::move(bucket));
  }
  metric.histogram.sample_count = cumulative_count;
  metric.histogram.sample_sum = sum_.Value();

  return metric;
}